

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

Frag __thiscall re2::Compiler::Literal(Compiler *this,Rune r,bool foldcase)

{
  int iVar1;
  undefined1 in_DL;
  int in_ESI;
  Frag in_RDI;
  int i;
  int n;
  uint8_t buf [4];
  Frag f;
  bool foldcase_00;
  undefined8 in_stack_ffffffffffffffcc;
  uint32_t in_stack_ffffffffffffffd4;
  PatchList in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int iVar2;
  char local_19;
  undefined3 in_stack_ffffffffffffffe8;
  uint uVar3;
  Frag in_stack_fffffffffffffff8;
  
  uVar3 = CONCAT13(in_DL,in_stack_ffffffffffffffe8) & 0x1ffffff;
  foldcase_00 = SUB81((ulong)in_stack_ffffffffffffffcc >> 0x18,0);
  iVar2 = (int)((ulong)in_stack_ffffffffffffffcc >> 0x20);
  if (*(int *)((long)in_RDI + 0x24) == 1) {
    if (in_ESI < 0x80) {
      in_stack_fffffffffffffff8 =
           ByteRange((Compiler *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8.p),
                     in_stack_ffffffffffffffd4,iVar2,foldcase_00);
    }
    else {
      iVar1 = runetochar(&local_19,(Rune *)&stack0xffffffffffffffec);
      in_stack_fffffffffffffff8 =
           ByteRange((Compiler *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8.p),
                     in_stack_ffffffffffffffd4,iVar2,foldcase_00);
      for (iVar2 = 1; iVar2 < iVar1; iVar2 = iVar2 + 1) {
        ByteRange((Compiler *)CONCAT44(iVar2,in_stack_ffffffffffffffd8.p),in_stack_ffffffffffffffd4,
                  in_stack_fffffffffffffff8.end.p.p,in_stack_fffffffffffffff8.begin._3_1_);
        in_stack_fffffffffffffff8 =
             Cat((Compiler *)CONCAT44(in_ESI,uVar3),in_stack_fffffffffffffff8,in_RDI);
        in_stack_ffffffffffffffd4 = in_stack_fffffffffffffff8.begin;
        in_stack_ffffffffffffffd8 = in_stack_fffffffffffffff8.end.p;
      }
    }
  }
  else if (*(int *)((long)in_RDI + 0x24) == 2) {
    in_stack_fffffffffffffff8 =
         ByteRange((Compiler *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8.p),
                   in_stack_ffffffffffffffd4,iVar2,foldcase_00);
  }
  else {
    Frag::Frag((Frag *)&stack0xfffffffffffffff8);
  }
  return in_stack_fffffffffffffff8;
}

Assistant:

Frag Compiler::Literal(Rune r, bool foldcase) {
  switch (encoding_) {
    default:
      return Frag();

    case kEncodingLatin1:
      return ByteRange(r, r, foldcase);

    case kEncodingUTF8: {
      if (r < Runeself)  // Make common case fast.
        return ByteRange(r, r, foldcase);
      uint8_t buf[UTFmax];
      int n = runetochar(reinterpret_cast<char*>(buf), &r);
      Frag f = ByteRange((uint8_t)buf[0], buf[0], false);
      for (int i = 1; i < n; i++)
        f = Cat(f, ByteRange((uint8_t)buf[i], buf[i], false));
      return f;
    }
  }
}